

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_muxer_metadata.cc
# Opt level: O0

bool __thiscall SampleMuxerMetadata::Write(SampleMuxerMetadata *this,int64_t time_ns)

{
  bool bVar1;
  reference this_00;
  _Self __position;
  value_type *v;
  iter_t j;
  iter_t i;
  int64_t time_ns_local;
  SampleMuxerMetadata *this_local;
  
  j._M_node = (_Base_ptr)
              std::
              multiset<SampleMuxerMetadata::SortableCue,_std::less<SampleMuxerMetadata::SortableCue>,_std::allocator<SampleMuxerMetadata::SortableCue>_>
              ::begin(&this->cues_set_);
  v = (value_type *)
      std::
      multiset<SampleMuxerMetadata::SortableCue,_std::less<SampleMuxerMetadata::SortableCue>,_std::allocator<SampleMuxerMetadata::SortableCue>_>
      ::end(&this->cues_set_);
  while( true ) {
    bVar1 = std::operator!=(&j,(_Self *)&v);
    if (!bVar1) {
      return true;
    }
    this_00 = std::_Rb_tree_const_iterator<SampleMuxerMetadata::SortableCue>::operator*(&j);
    if ((-1 < time_ns) && (bVar1 = SortableCue::operator>(this_00,time_ns), bVar1)) break;
    bVar1 = SortableCue::Write(this_00,this->segment_);
    if (!bVar1) {
      printf("\nCould not add metadata.\n");
      return false;
    }
    __position = std::_Rb_tree_const_iterator<SampleMuxerMetadata::SortableCue>::operator++(&j,0);
    std::
    multiset<SampleMuxerMetadata::SortableCue,std::less<SampleMuxerMetadata::SortableCue>,std::allocator<SampleMuxerMetadata::SortableCue>>
    ::erase_abi_cxx11_((multiset<SampleMuxerMetadata::SortableCue,std::less<SampleMuxerMetadata::SortableCue>,std::allocator<SampleMuxerMetadata::SortableCue>>
                        *)&this->cues_set_,(const_iterator)__position._M_node);
  }
  return true;
}

Assistant:

bool SampleMuxerMetadata::Write(int64_t time_ns) {
  typedef cues_set_t::iterator iter_t;

  iter_t i = cues_set_.begin();
  const iter_t j = cues_set_.end();

  while (i != j) {
    const cues_set_t::value_type& v = *i;

    if (time_ns >= 0 && v > time_ns)
      return true;  // nothing else to do just yet

    if (!v.Write(segment_)) {
      printf("\nCould not add metadata.\n");
      return false;  // error
    }

    cues_set_.erase(i++);
  }

  return true;
}